

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

void helper_xrstor_x86_64(CPUX86State *env,target_ulong ptr,uint64_t rfbm)

{
  byte *pbVar1;
  target_ulong ptr_00;
  uint32_t uVar2;
  int exception_index;
  uint32_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  CPUX86State *__mptr;
  ulong uVar7;
  long lVar8;
  uintptr_t unaff_retaddr;
  
  if ((*(byte *)((long)env->cr + 0x22) & 4) == 0) {
    exception_index = 6;
  }
  else {
    if ((ptr & 0x3f) == 0) {
      uVar7 = rfbm & env->xcr0;
      uVar4 = cpu_ldq_data_ra_x86_64(env,ptr + 0x200,unaff_retaddr);
      if ((-1 < (long)uVar4) && ((uVar4 & ~env->xcr0) == 0)) {
        uVar5 = cpu_ldq_data_ra_x86_64(env,ptr + 0x208,unaff_retaddr);
        uVar6 = cpu_ldq_data_ra_x86_64(env,ptr + 0x210,unaff_retaddr);
        if (uVar6 == 0 && uVar5 == 0) {
          if ((uVar7 & 1) != 0) {
            if ((uVar4 & 1) == 0) {
              do_fninit(env);
              env->fpregs[7].d.low = 0;
              *(undefined8 *)((long)env->fpregs + 0x78) = 0;
              env->fpregs[6].d.low = 0;
              *(undefined8 *)((long)env->fpregs + 0x68) = 0;
              env->fpregs[5].d.low = 0;
              *(undefined8 *)((long)env->fpregs + 0x58) = 0;
              env->fpregs[4].d.low = 0;
              *(undefined8 *)((long)env->fpregs + 0x48) = 0;
              env->fpregs[3].d.low = 0;
              *(undefined8 *)((long)env->fpregs + 0x38) = 0;
              env->fpregs[2].d.low = 0;
              *(undefined8 *)((long)env->fpregs + 0x28) = 0;
              env->fpregs[1].d.low = 0;
              *(undefined8 *)((long)env->fpregs + 0x18) = 0;
              env->fpregs[0].d.low = 0;
              *(undefined8 *)((long)env->fpregs + 8) = 0;
            }
            else {
              do_xrstor_fpu(env,ptr,unaff_retaddr);
            }
          }
          if ((uVar7 & 2) != 0) {
            do_xrstor_mxcsr(env,ptr,unaff_retaddr);
            if ((uVar4 & 2) == 0) {
              memset(env->xmm_regs,0,0x800);
            }
            else {
              do_xrstor_sse(env,ptr,unaff_retaddr);
            }
          }
          if ((uVar7 & 8) != 0) {
            if ((uVar4 & 8) == 0) {
              env->bnd_regs[3].lb = 0;
              env->bnd_regs[3].ub = 0;
              env->bnd_regs[2].lb = 0;
              env->bnd_regs[2].ub = 0;
              env->bnd_regs[1].lb = 0;
              env->bnd_regs[1].ub = 0;
              env->bnd_regs[0].lb = 0;
              env->bnd_regs[0].ub = 0;
              pbVar1 = (byte *)((long)&env->hflags + 3);
              *pbVar1 = *pbVar1 & 0xfb;
            }
            else {
              for (lVar8 = 0; lVar8 != 0x40; lVar8 = lVar8 + 0x10) {
                ptr_00 = lVar8 + ptr + 0x3c0;
                uVar5 = cpu_ldq_data_ra_x86_64(env,ptr_00,unaff_retaddr);
                *(uint64_t *)((long)&env->bnd_regs[0].lb + lVar8) = uVar5;
                uVar5 = cpu_ldq_data_ra_x86_64(env,ptr_00 + 8,unaff_retaddr);
                *(uint64_t *)((long)&env->bnd_regs[0].ub + lVar8) = uVar5;
              }
              pbVar1 = (byte *)((long)&env->hflags + 3);
              *pbVar1 = *pbVar1 | 4;
            }
          }
          if ((uVar7 & 0x10) != 0) {
            if ((uVar4 & 0x10) == 0) {
              (env->bndcs_regs).cfgu = 0;
              (env->bndcs_regs).sts = 0;
            }
            else {
              uVar5 = cpu_ldq_data_ra_x86_64(env,ptr + 0x400,unaff_retaddr);
              (env->bndcs_regs).cfgu = uVar5;
              uVar5 = cpu_ldq_data_ra_x86_64(env,ptr + 0x408,unaff_retaddr);
              (env->bndcs_regs).sts = uVar5;
            }
            cpu_sync_bndcs_hflags_x86_64(env);
          }
          if (((uint)uVar7 >> 9 & 1) != 0) {
            uVar2 = env->pkru;
            uVar3 = 0;
            if (((uint)uVar4 >> 9 & 1) != 0) {
              uVar4 = cpu_ldq_data_ra_x86_64(env,ptr + 0xa80,unaff_retaddr);
              uVar3 = (uint32_t)uVar4;
            }
            env->pkru = uVar3;
            if (uVar3 != uVar2) {
              tlb_flush_x86_64((CPUState *)(env[-6].mtrr_var + 4));
              return;
            }
          }
          return;
        }
      }
    }
    exception_index = 0xd;
  }
  raise_exception_ra_x86_64(env,exception_index,unaff_retaddr);
}

Assistant:

void helper_xrstor(CPUX86State *env, target_ulong ptr, uint64_t rfbm)
{
    uintptr_t ra = GETPC();
    uint64_t xstate_bv, xcomp_bv, reserve0;

    rfbm &= env->xcr0;

    /* The OS must have enabled XSAVE.  */
    if (!(env->cr[4] & CR4_OSXSAVE_MASK)) {
        raise_exception_ra(env, EXCP06_ILLOP, ra);
    }

    /* The operand must be 64 byte aligned.  */
    if (ptr & 63) {
        raise_exception_ra(env, EXCP0D_GPF, ra);
    }

    xstate_bv = cpu_ldq_data_ra(env, ptr + XO(header.xstate_bv), ra);

    if ((int64_t)xstate_bv < 0) {
        /* FIXME: Compact form.  */
        raise_exception_ra(env, EXCP0D_GPF, ra);
    }

    /* Standard form.  */

    /* The XSTATE_BV field must not set bits not present in XCR0.  */
    if (xstate_bv & ~env->xcr0) {
        raise_exception_ra(env, EXCP0D_GPF, ra);
    }

    /* The XCOMP_BV field must be zero.  Note that, as of the April 2016
       revision, the description of the XSAVE Header (Vol 1, Sec 13.4.2)
       describes only XCOMP_BV, but the description of the standard form
       of XRSTOR (Vol 1, Sec 13.8.1) checks bytes 23:8 for zero, which
       includes the next 64-bit field.  */
    xcomp_bv = cpu_ldq_data_ra(env, ptr + XO(header.xcomp_bv), ra);
    reserve0 = cpu_ldq_data_ra(env, ptr + XO(header.reserve0), ra);
    if (xcomp_bv || reserve0) {
        raise_exception_ra(env, EXCP0D_GPF, ra);
    }

    if (rfbm & XSTATE_FP_MASK) {
        if (xstate_bv & XSTATE_FP_MASK) {
            do_xrstor_fpu(env, ptr, ra);
        } else {
            do_fninit(env);
            memset(env->fpregs, 0, sizeof(env->fpregs));
        }
    }
    if (rfbm & XSTATE_SSE_MASK) {
        /* Note that the standard form of XRSTOR loads MXCSR from memory
           whether or not the XSTATE_BV bit is set.  */
        do_xrstor_mxcsr(env, ptr, ra);
        if (xstate_bv & XSTATE_SSE_MASK) {
            do_xrstor_sse(env, ptr, ra);
        } else {
            /* ??? When AVX is implemented, we may have to be more
               selective in the clearing.  */
            memset(env->xmm_regs, 0, sizeof(env->xmm_regs));
        }
    }
    if (rfbm & XSTATE_BNDREGS_MASK) {
        if (xstate_bv & XSTATE_BNDREGS_MASK) {
            do_xrstor_bndregs(env, ptr + XO(bndreg_state), ra);
            env->hflags |= HF_MPX_IU_MASK;
        } else {
            memset(env->bnd_regs, 0, sizeof(env->bnd_regs));
            env->hflags &= ~HF_MPX_IU_MASK;
        }
    }
    if (rfbm & XSTATE_BNDCSR_MASK) {
        if (xstate_bv & XSTATE_BNDCSR_MASK) {
            do_xrstor_bndcsr(env, ptr + XO(bndcsr_state), ra);
        } else {
            memset(&env->bndcs_regs, 0, sizeof(env->bndcs_regs));
        }
        cpu_sync_bndcs_hflags(env);
    }
    if (rfbm & XSTATE_PKRU_MASK) {
        uint64_t old_pkru = env->pkru;
        if (xstate_bv & XSTATE_PKRU_MASK) {
            do_xrstor_pkru(env, ptr + XO(pkru_state), ra);
        } else {
            env->pkru = 0;
        }
        if (env->pkru != old_pkru) {
            CPUState *cs = env_cpu(env);
            tlb_flush(cs);
        }
    }
}